

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::zext(APInt *this,uint width)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint64_t *__src;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt AVar6;
  uint width_local;
  APInt *this_local;
  APInt *Result;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,width);
  if (in_EDX <= this_00->BitWidth) {
    __assert_fail("width > BitWidth && \"Invalid APInt ZeroExtend request\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x361,"APInt llvm::APInt::zext(unsigned int) const");
  }
  if (in_EDX < 0x41) {
    APInt(this,in_EDX,(this_00->U).VAL,false);
    uVar5 = extraout_RDX;
  }
  else {
    uVar1 = getNumWords(in_EDX);
    puVar4 = getMemory(uVar1);
    APInt(this,puVar4,in_EDX);
    puVar4 = (this->U).pVal;
    __src = getRawData(this_00);
    uVar1 = getNumWords(this_00);
    memcpy(puVar4,__src,(ulong)(uVar1 << 3));
    puVar4 = (this->U).pVal;
    uVar1 = getNumWords(this_00);
    uVar2 = getNumWords(this);
    uVar3 = getNumWords(this_00);
    memset(puVar4 + uVar1,0,(ulong)((uVar2 - uVar3) * 8));
    uVar5 = extraout_RDX_00;
  }
  AVar6._8_8_ = uVar5;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::zext(unsigned width) const {
  assert(width > BitWidth && "Invalid APInt ZeroExtend request");

  if (width <= APINT_BITS_PER_WORD)
    return APInt(width, U.VAL);

  APInt Result(getMemory(getNumWords(width)), width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Zero remaining words.
  std::memset(Result.U.pVal + getNumWords(), 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);

  return Result;
}